

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repetition.hpp
# Opt level: O2

void InstructionSet::x86::Primitive::
     movs<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)3,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> *instruction,unsigned_short *eCX,unsigned_short *eSI,
               unsigned_short *eDI,Context *context)

{
  short sVar1;
  type_conflict2 tVar2;
  type tVar3;
  
  if (*eCX != 0) {
    tVar2 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)0>
                      (&context->memory,(Source)(instruction->source_data_dest_sib_ >> 10) & BH | ES
                       ,*eSI);
    tVar3 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)1>
                      (&context->memory,ES,*eDI);
    *tVar3.target_ = tVar2;
    sVar1 = (short)(context->flags).direction_ * 2;
    *eSI = *eSI + sVar1;
    *eDI = *eDI + sVar1;
    *eCX = *eCX - 1;
    if (*eCX != 0) {
      (context->flow_controller).should_repeat_ = true;
    }
  }
  return;
}

Assistant:

bool repetition_over(
	const AddressT &eCX
) {
	return repetition != Repetition::None && !eCX;
}